

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O2

fxp_xfer * xfer_init(fxp_handle *fh,uint64_t offset)

{
  fxp_xfer *pfVar1;
  
  pfVar1 = (fxp_xfer *)safemalloc(1,0x40,0);
  pfVar1->fh = fh;
  pfVar1->offset = offset;
  pfVar1->req_totalsize = 0;
  pfVar1->req_maxsize = 0x100000;
  pfVar1->head = (req *)0x0;
  pfVar1->tail = (req *)0x0;
  pfVar1->err = false;
  pfVar1->filesize = 0xffffffffffffffff;
  pfVar1->furthestdata = 0;
  return pfVar1;
}

Assistant:

static struct fxp_xfer *xfer_init(struct fxp_handle *fh, uint64_t offset)
{
    struct fxp_xfer *xfer = snew(struct fxp_xfer);

    xfer->fh = fh;
    xfer->offset = offset;
    xfer->head = xfer->tail = NULL;
    xfer->req_totalsize = 0;
    xfer->req_maxsize = 1048576;
    xfer->err = false;
    xfer->filesize = UINT64_MAX;
    xfer->furthestdata = 0;

    return xfer;
}